

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso2.c
# Opt level: O3

Vec_Wec_t * Gia_Iso2ManDerivePoClasses(Gia_Man_t *pGia)

{
  ulong uVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  Vec_Int_t *pVVar5;
  int *piVar6;
  Vec_Int_t *pVVar7;
  void *__s;
  uint *puVar8;
  void *__ptr;
  int *piVar9;
  uint *puVar10;
  Vec_Wec_t *pVVar11;
  int iVar12;
  long lVar13;
  uint uVar14;
  int iVar15;
  ulong uVar16;
  int iVar17;
  uint uVar18;
  long lVar19;
  uint uVar20;
  ulong uVar21;
  uint local_44;
  
  iVar15 = pGia->nRegs;
  pVVar7 = pGia->vCos;
  uVar20 = pVVar7->nSize;
  uVar21 = (ulong)uVar20;
  iVar17 = uVar20 - iVar15;
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  iVar12 = 0x10;
  if (0xe < iVar17 - 1U) {
    iVar12 = iVar17;
  }
  pVVar5->nSize = 0;
  pVVar5->nCap = iVar12;
  uVar18 = 0;
  if (iVar12 == 0) {
    piVar6 = (int *)0x0;
  }
  else {
    piVar6 = (int *)malloc((long)iVar12 << 2);
  }
  pVVar5->pArray = piVar6;
  if (iVar15 < (int)uVar20) {
    lVar19 = 0;
    do {
      if ((int)uVar21 <= lVar19) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar15 = pVVar7->pArray[lVar19];
      if (((long)iVar15 < 0) || (pGia->nObjs <= iVar15)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (pGia->pObjs == (Gia_Obj_t *)0x0) break;
      Vec_IntPush(pVVar5,pGia->pObjs[iVar15].Value);
      lVar19 = lVar19 + 1;
      pVVar7 = pGia->vCos;
      uVar21 = (ulong)pVVar7->nSize;
    } while (lVar19 < (long)(uVar21 - (long)pGia->nRegs));
    uVar18 = pVVar5->nSize;
  }
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  pVVar7->nCap = 100;
  pVVar7->nSize = 0;
  piVar6 = (int *)malloc(400);
  pVVar7->pArray = piVar6;
  uVar20 = uVar18 - 1;
  while( true ) {
    do {
      uVar14 = uVar20;
      uVar20 = uVar14 + 1;
    } while ((uVar14 & 1) != 0);
    if (uVar20 < 9) break;
    iVar15 = 5;
    while (uVar20 % (iVar15 - 2U) != 0) {
      uVar3 = iVar15 * iVar15;
      iVar15 = iVar15 + 2;
      if (uVar20 < uVar3) goto LAB_007561a9;
    }
  }
LAB_007561a9:
  local_44 = uVar20;
  if (uVar14 < 0xf) {
    local_44 = 0x10;
  }
  __s = malloc((long)(int)local_44 << 2);
  if (__s != (void *)0x0) {
    memset(__s,0xff,(long)(int)uVar20 << 2);
  }
  puVar8 = (uint *)malloc(0x10);
  uVar14 = 0x10;
  if (0xe < uVar18 - 1) {
    uVar14 = uVar18;
  }
  puVar8[1] = 0;
  *puVar8 = uVar14;
  if (uVar14 == 0) {
    __ptr = (void *)0x0;
  }
  else {
    __ptr = malloc((long)(int)uVar14 << 3);
  }
  *(void **)(puVar8 + 2) = __ptr;
  if (0 < (int)uVar18) {
    lVar19 = 0;
    uVar21 = 0;
    uVar14 = 0;
    do {
      if ((int)uVar20 < (int)uVar14) {
        uVar20 = uVar20 * 2 - 1;
        while( true ) {
          do {
            uVar3 = uVar20;
            uVar20 = uVar3 + 1;
          } while ((uVar3 & 1) != 0);
          if (uVar20 < 9) break;
          iVar15 = 5;
          while (uVar20 % (iVar15 - 2U) != 0) {
            uVar4 = iVar15 * iVar15;
            iVar15 = iVar15 + 2;
            if (uVar20 < uVar4) goto LAB_0075627f;
          }
        }
LAB_0075627f:
        if ((int)local_44 < (int)uVar20) {
          if (__s == (void *)0x0) {
            __s = malloc((long)(int)uVar20 << 2);
          }
          else {
            __s = realloc(__s,(long)(int)uVar20 << 2);
          }
          local_44 = uVar20;
          if (__s == (void *)0x0) {
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
          }
        }
        if (uVar3 < 0x7fffffff) {
          memset(__s,0xff,(ulong)uVar20 << 2);
        }
        if (0 < (int)uVar14) {
          uVar16 = 0;
          do {
            iVar15 = *(int *)((long)__ptr + uVar16 * 8);
            if (((long)iVar15 < 0) || (pVVar5->nSize <= iVar15)) goto LAB_007566e4;
            lVar13 = 0;
            uVar3 = 0;
            do {
              lVar2 = lVar13 + (long)iVar15 * 4;
              lVar13 = lVar13 + 1;
              uVar3 = (*(byte *)((long)pVVar5->pArray + lVar2) + uVar3) * 0x401;
              uVar3 = uVar3 >> 6 ^ uVar3;
            } while (lVar13 != 4);
            uVar1 = (ulong)((uVar3 * 9 >> 0xb ^ uVar3 * 9) * 0x8001) % (ulong)uVar20;
            if (((int)uVar1 < 0) || ((int)uVar20 <= (int)uVar1)) goto LAB_007566e4;
            *(undefined4 *)((long)__ptr + uVar16 * 8 + 4) = *(undefined4 *)((long)__s + uVar1 * 4);
            *(int *)((long)__s + uVar1 * 4) = (int)uVar16;
            uVar16 = uVar16 + 1;
          } while (uVar16 != uVar14);
        }
      }
      if ((long)pVVar5->nSize <= (long)uVar21) {
LAB_007566e4:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      piVar6 = pVVar5->pArray;
      lVar13 = 0;
      uVar3 = 0;
      do {
        lVar2 = lVar13 + lVar19;
        lVar13 = lVar13 + 1;
        uVar3 = (*(byte *)((long)piVar6 + lVar2) + uVar3) * 0x401;
        uVar3 = uVar3 >> 6 ^ uVar3;
      } while (lVar13 != 4);
      uVar16 = (ulong)((uVar3 * 9 >> 0xb ^ uVar3 * 9) * 0x8001) % (ulong)uVar20;
      if (((int)uVar16 < 0) || ((int)uVar20 <= (int)uVar16)) goto LAB_007566e4;
      uVar3 = *(uint *)((long)__s + uVar16 * 4);
      if (uVar3 == 0xffffffff) {
        puVar10 = (uint *)(uVar16 * 4 + (long)__s);
      }
      else {
        do {
          if (((int)uVar3 < 0) || ((int)uVar14 <= (int)uVar3)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                          ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
          }
          if (__ptr == (void *)0x0) {
            __assert_fail("*pPlace == -1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecHsh.h"
                          ,0x138,"int *Hsh_IntManLookup(Hsh_IntMan_t *, unsigned int *)");
          }
          piVar9 = (int *)((ulong)uVar3 * 8 + (long)__ptr);
          iVar15 = *piVar9;
          if (((long)iVar15 < 0) || (pVVar5->nSize <= iVar15)) goto LAB_007566e4;
          uVar4 = uVar14;
          if (piVar6[uVar21] == piVar6[iVar15]) goto LAB_007564ec;
          uVar3 = piVar9[1];
        } while (uVar3 != 0xffffffff);
        puVar10 = (uint *)(piVar9 + 1);
      }
      *puVar10 = uVar14;
      if (uVar14 == *puVar8) {
        if ((int)uVar14 < 0x10) {
          if (__ptr == (void *)0x0) {
            __ptr = malloc(0x80);
          }
          else {
            __ptr = realloc(__ptr,0x80);
          }
          *(void **)(puVar8 + 2) = __ptr;
          uVar3 = 0x10;
        }
        else {
          uVar3 = uVar14 * 2;
          if (__ptr == (void *)0x0) {
            __ptr = malloc((ulong)uVar3 * 8);
          }
          else {
            __ptr = realloc(__ptr,(ulong)uVar3 * 8);
          }
          *(void **)(puVar8 + 2) = __ptr;
        }
        if (__ptr == (void *)0x0) {
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                        ,0x205,"void Vec_WrdGrow(Vec_Wrd_t *, int)");
        }
        *puVar8 = uVar3;
      }
      *(ulong *)((long)__ptr + (long)(int)uVar14 * 8) = uVar21 | 0xffffffff00000000;
      uVar4 = uVar14 + 1;
      uVar3 = uVar14;
LAB_007564ec:
      uVar14 = uVar4;
      Vec_IntPush(pVVar7,uVar3);
      uVar21 = uVar21 + 1;
      lVar19 = lVar19 + 4;
    } while (uVar21 != uVar18);
    puVar8[1] = uVar14;
  }
  if (__s != (void *)0x0) {
    free(__s);
    __ptr = *(void **)(puVar8 + 2);
  }
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
  free(puVar8);
  if (pVVar5->pArray != (int *)0x0) {
    free(pVVar5->pArray);
  }
  free(pVVar5);
  uVar20 = pVVar7->nSize;
  uVar21 = (ulong)uVar20;
  if (uVar21 == 0) {
    pVVar11 = (Vec_Wec_t *)malloc(0x10);
    puVar8 = (uint *)pVVar7->pArray;
    iVar15 = 1;
LAB_007565d0:
    pVVar11->nCap = 8;
    iVar12 = 8;
LAB_007565de:
    pVVar5 = (Vec_Int_t *)calloc((long)iVar12,0x10);
  }
  else {
    puVar8 = (uint *)pVVar7->pArray;
    uVar18 = *puVar8;
    if (1 < (int)uVar20) {
      uVar16 = 1;
      do {
        if ((int)uVar18 <= (int)puVar8[uVar16]) {
          uVar18 = puVar8[uVar16];
        }
        uVar16 = uVar16 + 1;
      } while (uVar21 != uVar16);
    }
    iVar12 = uVar18 + 1;
    pVVar11 = (Vec_Wec_t *)malloc(0x10);
    iVar15 = iVar12;
    if (uVar18 < 7) goto LAB_007565d0;
    pVVar11->nCap = iVar12;
    if (iVar12 != 0) goto LAB_007565de;
    iVar15 = 0;
    pVVar5 = (Vec_Int_t *)0x0;
  }
  pVVar11->pArray = pVVar5;
  pVVar11->nSize = iVar15;
  if ((int)uVar20 < 1) {
    if (puVar8 == (uint *)0x0) goto LAB_007566bf;
  }
  else {
    uVar16 = 0;
    do {
      uVar20 = puVar8[uVar16];
      iVar15 = pVVar11->nSize;
      if (iVar15 <= (int)uVar20) {
        iVar17 = uVar20 + 1;
        iVar12 = iVar15 * 2;
        if (iVar15 * 2 <= iVar17) {
          iVar12 = iVar17;
        }
        iVar15 = pVVar11->nCap;
        if (iVar15 < iVar12) {
          if (pVVar11->pArray == (Vec_Int_t *)0x0) {
            pVVar5 = (Vec_Int_t *)malloc((long)iVar12 << 4);
          }
          else {
            pVVar5 = (Vec_Int_t *)realloc(pVVar11->pArray,(long)iVar12 << 4);
          }
          pVVar11->pArray = pVVar5;
          memset(pVVar5 + iVar15,0,(long)(iVar12 - iVar15) << 4);
          pVVar11->nCap = iVar12;
        }
        pVVar11->nSize = iVar17;
        iVar15 = iVar17;
      }
      if (((int)uVar20 < 0) || (iVar15 <= (int)uVar20)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      Vec_IntPush(pVVar11->pArray + uVar20,(int)uVar16);
      uVar16 = uVar16 + 1;
    } while (uVar21 != uVar16);
  }
  free(puVar8);
LAB_007566bf:
  free(pVVar7);
  return pVVar11;
}

Assistant:

Vec_Wec_t * Gia_Iso2ManDerivePoClasses( Gia_Man_t * pGia )
{
    Vec_Wec_t * vEquivs;
    Vec_Int_t * vValues;
    Vec_Int_t * vMap;
    Gia_Obj_t * pObj;
    int i;
    vValues = Vec_IntAlloc( Gia_ManPoNum(pGia) );
    Gia_ManForEachPo( pGia, pObj, i )
        Vec_IntPush( vValues, pObj->Value );
    vMap = Hsh_IntManHashArray( vValues, 1 );
    Vec_IntFree( vValues );
    vEquivs = Vec_WecCreateClasses( vMap );
    Vec_IntFree( vMap );
    return vEquivs;    
}